

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O2

void Cec_ManSatPrintStats(Cec_ManSat_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *Time;
  abctime time;
  int iVar2;
  Cec_ManSat_t *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pCVar3 = p;
  Abc_Print((int)p,"CO = %8d  ",(ulong)(uint)p->pAig->vCos->nSize);
  pGVar1 = p->pAig;
  Time = pGVar1->vCis;
  iVar2 = (int)pCVar3;
  Abc_Print(iVar2,"AND = %8d  ",(ulong)(uint)(~(pGVar1->vCos->nSize + Time->nSize) + pGVar1->nObjs))
  ;
  Abc_Print(iVar2,"Conf = %5d  ",(ulong)(uint)p->pPars->nBTLimit);
  Abc_Print(iVar2,"MinVar = %5d  ",(ulong)(uint)p->pPars->nSatVarMax);
  Abc_Print(iVar2,"MinCalls = %5d\n",(ulong)(uint)p->pPars->nCallsRecycle);
  dVar6 = (double)p->nSatUnsat;
  dVar5 = 0.0;
  dVar4 = 0.0;
  if (p->nSatTotal != 0) {
    dVar4 = (dVar6 * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUnsat != 0) {
    dVar5 = (double)p->nConfUnsat / dVar6;
  }
  Abc_Print(iVar2,"Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar4,dVar5);
  iVar2 = 0x7bf12c;
  Abc_PrintTimeP(0x7bf12c,(char *)(long)p->timeSatUnsat,(long)p->timeTotal,(abctime)Time);
  dVar6 = (double)p->nSatSat;
  dVar5 = 0.0;
  dVar4 = 0.0;
  if (p->nSatTotal != 0) {
    dVar4 = (dVar6 * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatSat != 0) {
    dVar5 = (double)p->nConfSat / dVar6;
  }
  Abc_Print(iVar2,"Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar4,dVar5);
  iVar2 = 0x7bf12c;
  Abc_PrintTimeP(0x7bf12c,(char *)(long)p->timeSatSat,(long)p->timeTotal,(abctime)Time);
  dVar6 = (double)p->nSatUndec;
  dVar4 = 0.0;
  dVar5 = 0.0;
  if (p->nSatUndec != 0) {
    dVar5 = (double)p->nConfUndec / dVar6;
  }
  if (p->nSatTotal != 0) {
    dVar4 = (dVar6 * 100.0) / (double)p->nSatTotal;
  }
  Abc_Print(iVar2,"Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar4,dVar5);
  Abc_PrintTimeP(0x7bf12c,(char *)(long)p->timeSatUndec,(long)p->timeTotal,(abctime)Time);
  Abc_PrintTime(0x6e8915,(char *)(long)p->timeTotal,time);
  return;
}

Assistant:

void Cec_ManSatPrintStats( Cec_ManSat_t * p )
{
    Abc_Print( 1, "CO = %8d  ", Gia_ManCoNum(p->pAig) );
    Abc_Print( 1, "AND = %8d  ", Gia_ManAndNum(p->pAig) );
    Abc_Print( 1, "Conf = %5d  ", p->pPars->nBTLimit );
    Abc_Print( 1, "MinVar = %5d  ", p->pPars->nSatVarMax );
    Abc_Print( 1, "MinCalls = %5d\n", p->pPars->nCallsRecycle );
    Abc_Print( 1, "Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUnsat, p->nSatTotal? 100.0*p->nSatUnsat/p->nSatTotal : 0.0, p->nSatUnsat? 1.0*p->nConfUnsat/p->nSatUnsat :0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatUnsat, p->timeTotal );
    Abc_Print( 1, "Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatSat,   p->nSatTotal? 100.0*p->nSatSat/p->nSatTotal : 0.0,   p->nSatSat? 1.0*p->nConfSat/p->nSatSat : 0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatSat,   p->timeTotal );
    Abc_Print( 1, "Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUndec, p->nSatTotal? 100.0*p->nSatUndec/p->nSatTotal : 0.0, p->nSatUndec? 1.0*p->nConfUndec/p->nSatUndec : 0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatUndec, p->timeTotal );
    Abc_PrintTime( 1, "Total time", p->timeTotal );
}